

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O3

void SudokuGitter::printIntVec
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,string *name)

{
  ostream *poVar1;
  uint uVar2;
  ulong uVar3;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  if ((vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar3 < (ulong)((long)(vec->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(vec->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  return;
}

Assistant:

void SudokuGitter::printIntVec(vector<unsigned int> vec, string name) {
    // Print Original Vector
    std::cout << name << ": ";
    for (unsigned int i = 0; i < vec.size(); i++)
        std::cout << " " << vec[i];

    std::cout << std::endl;
}